

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O0

void absl::lts_20240722::cord_internal::CordzInfo::TrackCord
               (InlineData *cord,InlineData *src,MethodIdentifier method)

{
  bool bVar1;
  CordzInfo *pCVar2;
  CordRep *rep;
  CordzInfo *src_00;
  CordzInfo *this;
  int64_t sampling_stride;
  CordzInfo *cordz_info;
  MethodIdentifier method_local;
  InlineData *src_local;
  InlineData *cord_local;
  
  bVar1 = InlineData::is_tree(cord);
  if (!bVar1) {
    __assert_fail("cord.is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/strings/internal/cordz_info.cc"
                  ,0x108,
                  "static void absl::cord_internal::CordzInfo::TrackCord(InlineData &, const InlineData &, MethodIdentifier)"
                 );
  }
  bVar1 = InlineData::is_tree(src);
  if (!bVar1) {
    __assert_fail("src.is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/strings/internal/cordz_info.cc"
                  ,0x109,
                  "static void absl::cord_internal::CordzInfo::TrackCord(InlineData &, const InlineData &, MethodIdentifier)"
                 );
  }
  pCVar2 = InlineData::cordz_info(cord);
  if (pCVar2 != (CordzInfo *)0x0) {
    Untrack(pCVar2);
  }
  pCVar2 = (CordzInfo *)operator_new(0x540);
  rep = InlineData::as_tree(cord);
  src_00 = InlineData::cordz_info(src);
  this = InlineData::cordz_info(src);
  sampling_stride = CordzInfo::sampling_stride(this);
  CordzInfo(pCVar2,rep,src_00,method,sampling_stride);
  InlineData::set_cordz_info(cord,pCVar2);
  Track(pCVar2);
  return;
}

Assistant:

void CordzInfo::TrackCord(InlineData& cord, const InlineData& src,
                          MethodIdentifier method) {
  assert(cord.is_tree());
  assert(src.is_tree());

  // Unsample current as we the current cord is being replaced with 'src',
  // so any method history is no longer relevant.
  CordzInfo* cordz_info = cord.cordz_info();
  if (cordz_info != nullptr) cordz_info->Untrack();

  // Start new cord sample
  cordz_info = new CordzInfo(cord.as_tree(), src.cordz_info(), method,
                             src.cordz_info()->sampling_stride());
  cord.set_cordz_info(cordz_info);
  cordz_info->Track();
}